

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O3

Texture2D * __thiscall deqp::gls::RandomShaderCase::getTex2D(RandomShaderCase *this)

{
  GLenum err;
  Texture2D *pTVar1;
  Vec4 local_38;
  Vec4 local_28;
  
  pTVar1 = this->m_tex2D;
  if (pTVar1 == (Texture2D *)0x0) {
    pTVar1 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D(pTVar1,this->m_renderCtx,0x1908,0x1401,0x40,0x40);
    this->m_tex2D = pTVar1;
    tcu::Texture2D::allocLevel(&pTVar1->m_refTexture,0);
    local_28.m_data[0] = -1.0;
    local_28.m_data[1] = -1.0;
    local_28.m_data[2] = -1.0;
    local_28.m_data[3] = 2.0;
    local_38.m_data[0] = 1.0;
    local_38.m_data[1] = 1.0;
    local_38.m_data[2] = 1.0;
    local_38.m_data[3] = 0.0;
    tcu::fillWithComponentGradients
              ((this->m_tex2D->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,&local_28,&local_38);
    (*this->m_tex2D->_vptr_Texture2D[2])();
    glwBindTexture(0xde1,this->m_tex2D->m_glTexture);
    glwTexParameteri(0xde1,0x2802,0x812f);
    glwTexParameteri(0xde1,0x2803,0x812f);
    glwTexParameteri(0xde1,0x2801,0x2601);
    glwTexParameteri(0xde1,0x2800,0x2601);
    err = glwGetError();
    glu::checkError(err,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x137);
    pTVar1 = this->m_tex2D;
  }
  return pTVar1;
}

Assistant:

const glu::Texture2D* RandomShaderCase::getTex2D (void)
{
	if (!m_tex2D)
	{
		m_tex2D = new glu::Texture2D(m_renderCtx, TEXTURE_2D_FORMAT, TEXTURE_2D_DATA_TYPE, TEXTURE_2D_WIDTH, TEXTURE_2D_HEIGHT);

		m_tex2D->getRefTexture().allocLevel(0);
		tcu::fillWithComponentGradients(m_tex2D->getRefTexture().getLevel(0), tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f));
		m_tex2D->upload();

		// Setup parameters.
		glBindTexture(GL_TEXTURE_2D, m_tex2D->getGLTexture());
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		TEXTURE_WRAP_S);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		TEXTURE_WRAP_T);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	TEXTURE_MIN_FILTER);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	TEXTURE_MAG_FILTER);

		GLU_CHECK();
	}

	return m_tex2D;
}